

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFMatrix.cc
# Opt level: O1

void __thiscall QPDFMatrix::rotatex90(QPDFMatrix *this,int angle)

{
  QPDFMatrix local_30;
  
  if (angle == 0x10e) {
    local_30.b = -1.0;
    local_30.c = 1.0;
  }
  else {
    if (angle == 0xb4) {
      local_30.a = -1.0;
      local_30.b = 0.0;
      local_30.c = 0.0;
      local_30.d = -1.0;
      goto LAB_001bc327;
    }
    if (angle != 0x5a) {
      return;
    }
    local_30.b = 1.0;
    local_30.c = -1.0;
  }
  local_30.a = 0.0;
  local_30.d = 0.0;
LAB_001bc327:
  local_30.f = 0.0;
  local_30.e = 0.0;
  concat(this,&local_30);
  return;
}

Assistant:

void
QPDFMatrix::rotatex90(int angle)
{
    switch (angle) {
    case 90:
        concat(QPDFMatrix(0, 1, -1, 0, 0, 0));
        break;
    case 180:
        concat(QPDFMatrix(-1, 0, 0, -1, 0, 0));
        break;
    case 270:
        concat(QPDFMatrix(0, -1, 1, 0, 0, 0));
        break;
    default:
        // ignore
        break;
    }
}